

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int lws_clean_url(char *p)

{
  char *pcVar1;
  char *local_18;
  char *p1;
  char *p_local;
  
  pcVar1 = p;
  if ((((*p == 'h') && (pcVar1 = p, p[1] == 't')) && (pcVar1 = p, p[2] == 't')) &&
     (pcVar1 = p, p[3] == 'p')) {
    p1 = p + 4;
    if (*p1 == 's') {
      p1 = p + 5;
    }
    pcVar1 = p1;
    if ((*p1 == ':') && (pcVar1 = p1 + 1, p1[1] == '/')) {
      pcVar1 = p1 + 2;
    }
  }
  while (p1 = pcVar1, *p1 != '\0') {
    if ((*p1 == '/') && (p1[1] == '/')) {
      for (local_18 = p1; pcVar1 = p1, *local_18 != '\0'; local_18 = local_18 + 1) {
        *local_18 = local_18[1];
      }
    }
    else {
      pcVar1 = p1 + 1;
    }
  }
  return 0;
}

Assistant:

int lws_clean_url(char *p)
{
	if (p[0] == 'h' && p[1] == 't' && p[2] == 't' && p[3] == 'p') {
		p += 4;
		if (*p == 's')
		p++;
		if (*p == ':') {
			p++;
			if (*p == '/')
			p++;
		}
	}

	while (*p) {
		if (p[0] == '/' && p[1] == '/') {
			char *p1 = p;
			while (*p1) {
				*p1 = p1[1];
				p1++;
			}
			continue;
		}
		p++;
	}

	return 0;
}